

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramFunctor,short,duckdb::DefaultMapType<std::unordered_map<short,unsigned_long,std::hash<short>,std::equal_to<short>,std::allocator<std::pair<short_const,unsigned_long>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  bool bVar1;
  Vector *pVVar2;
  idx_t iVar3;
  idx_t iVar4;
  Vector *this;
  Vector *result_00;
  reference ppVar5;
  ulong in_RCX;
  long in_R8;
  pair<const_short,_unsigned_long> *entry;
  iterator __end0;
  iterator __begin0;
  unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
  *__range3;
  list_entry_t *list_entry;
  HistogramAggState<short,_std::unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
  *state_1;
  idx_t rid;
  idx_t i_1;
  idx_t current_offset;
  unsigned_long *count_entries;
  list_entry_t *list_entries;
  Vector *values;
  Vector *keys;
  HistogramAggState<short,_std::unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
  *state;
  idx_t i;
  idx_t new_entries;
  idx_t old_len;
  ValidityMask *mask;
  HistogramAggState<short,_std::unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
  **states;
  UnifiedVectorFormat sdata;
  Vector *in_stack_fffffffffffffe98;
  Vector *in_stack_fffffffffffffea0;
  UnifiedVectorFormat *in_stack_fffffffffffffeb0;
  _Node_iterator_base<std::pair<const_short,_unsigned_long>,_false> local_110;
  _Node_iterator_base<std::pair<const_short,_unsigned_long>,_false> local_108;
  long local_100;
  VectorType *local_f8;
  long *local_f0;
  long local_e8;
  ulong local_e0;
  idx_t local_d8;
  Vector *local_d0;
  Vector *local_c8;
  Vector *local_c0;
  Vector *local_b8;
  long *local_b0;
  ulong local_a8;
  UnifiedVectorFormat *in_stack_ffffffffffffff60;
  idx_t in_stack_ffffffffffffff68;
  Vector *in_stack_ffffffffffffff70;
  UnifiedVectorFormat local_70;
  long local_28;
  ulong local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffeb0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  pVVar2 = (Vector *)
           UnifiedVectorFormat::
           GetData<duckdb::HistogramAggState<short,std::unordered_map<short,unsigned_long,std::hash<short>,std::equal_to<short>,std::allocator<std::pair<short_const,unsigned_long>>>>*>
                     (&local_70);
  FlatVector::Validity((Vector *)0x1e4e06f);
  iVar3 = ListVector::GetListSize(in_stack_fffffffffffffe98);
  for (local_a8 = 0; local_a8 < local_20; local_a8 = local_a8 + 1) {
    iVar4 = SelectionVector::get_index(local_70.sel,local_a8);
    local_b0 = *(long **)(&pVVar2->vector_type + iVar4 * 8);
    if (*local_b0 != 0) {
      ::std::
      unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
      ::size((unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
              *)0x1e4e14e);
    }
  }
  ListVector::Reserve(in_stack_fffffffffffffea0,(idx_t)in_stack_fffffffffffffe98);
  local_b8 = MapVector::GetKeys(in_stack_fffffffffffffea0);
  local_c0 = MapVector::GetValues(in_stack_fffffffffffffea0);
  this = (Vector *)FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x1e4e1e8);
  local_c8 = this;
  local_d8 = iVar3;
  result_00 = (Vector *)FlatVector::GetData<unsigned_long>((Vector *)0x1e4e209);
  local_d0 = result_00;
  for (local_e0 = 0; local_e0 < local_20; local_e0 = local_e0 + 1) {
    local_e8 = local_e0 + local_28;
    in_stack_fffffffffffffea0 = pVVar2;
    iVar3 = SelectionVector::get_index(local_70.sel,local_e0);
    local_f0 = *(long **)(&in_stack_fffffffffffffea0->vector_type + iVar3 * 8);
    if (*local_f0 == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffea0,
                 (idx_t)in_stack_fffffffffffffe98);
    }
    else {
      local_f8 = &local_c8->vector_type + local_e8 * 0x10;
      *(idx_t *)local_f8 = local_d8;
      local_100 = *local_f0;
      local_108._M_cur =
           (__node_type *)
           ::std::
           unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
           ::begin((unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffe98);
      local_110._M_cur =
           (__node_type *)
           ::std::
           unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
           ::end((unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffe98);
      while (bVar1 = ::std::__detail::operator!=(&local_108,&local_110), bVar1) {
        ppVar5 = ::std::__detail::
                 _Node_iterator<std::pair<const_short,_unsigned_long>,_false,_false>::operator*
                           ((_Node_iterator<std::pair<const_short,_unsigned_long>,_false,_false> *)
                            0x1e4e337);
        HistogramFunctor::HistogramFinalize<short>
                  ((short)((ulong)this >> 0x30),result_00,(idx_t)in_stack_fffffffffffffea0);
        *(unsigned_long *)(&local_d0->vector_type + local_d8 * 8) = ppVar5->second;
        local_d8 = local_d8 + 1;
        ::std::__detail::_Node_iterator<std::pair<const_short,_unsigned_long>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_short,_unsigned_long>,_false,_false> *)
                   in_stack_fffffffffffffea0);
      }
      *(idx_t *)(local_f8 + 8) = local_d8 - *(idx_t *)local_f8;
    }
  }
  ListVector::SetListSize(in_stack_fffffffffffffea0,(idx_t)in_stack_fffffffffffffe98);
  Vector::Verify(this,(idx_t)result_00);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}